

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O1

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  uint *puVar1;
  uint *puVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  BYTE *d;
  uint *puVar6;
  BYTE *s;
  undefined4 uVar7;
  char *pcVar8;
  ushort *__src;
  ushort *puVar9;
  ulong uVar10;
  char *pcVar11;
  uint *puVar12;
  uint *puVar13;
  BYTE *d_1;
  uint uVar14;
  size_t __n;
  BYTE *oCopyLimit;
  int local_50;
  char *local_38;
  
  if (originalSize != 0) {
    puVar2 = (uint *)(dest + originalSize);
    puVar13 = (uint *)(dest + (long)originalSize + -0xc);
    puVar1 = (uint *)((long)puVar2 - 7);
    __src = (ushort *)source;
switchD_0010a9c0_caseD_0:
    uVar4 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar14 = (uint)(byte)((byte)uVar4 >> 4);
    __n = (size_t)uVar14;
    if (uVar14 == 0xf) {
      __n = 0xf;
      do {
        uVar5 = *__src;
        __src = (ushort *)((long)__src + 1);
        __n = __n + (byte)uVar5;
      } while ((ulong)(byte)uVar5 == 0xff);
    }
    puVar12 = (uint *)((long)dest + __n);
    puVar9 = __src;
    if (puVar2 + -2 < puVar12) {
      uVar7 = 6;
      if (puVar12 == puVar2) {
        memcpy(dest,__src,__n);
        __src = (ushort *)((long)__src + __n);
        uVar7 = 3;
        dest = (char *)puVar12;
      }
    }
    else {
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar9;
        dest = (char *)((long)dest + 8);
        puVar9 = puVar9 + 4;
      } while (dest < puVar12);
      puVar9 = (ushort *)((long)__src + __n);
      __src = puVar9 + 1;
      uVar5 = *puVar9;
      *puVar12 = (uint)uVar5;
      uVar10 = (ulong)((byte)uVar4 & 0xf);
      if (uVar10 == 0xf) {
        uVar10 = 0xf;
        do {
          uVar4 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar10 = uVar10 + (byte)uVar4;
        } while ((ulong)(byte)uVar4 == 0xff);
      }
      if (uVar5 < 8) {
        LZ4_decompress_fast_cold_1();
        pcVar11 = local_38;
      }
      else {
        *(undefined8 *)puVar12 = *(undefined8 *)((long)puVar12 - (ulong)uVar5);
        pcVar11 = (char *)((undefined8 *)((long)puVar12 - (ulong)uVar5) + 1);
      }
      puVar6 = (uint *)((long)puVar12 + uVar10 + 4);
      dest = (char *)(puVar12 + 2);
      if (puVar13 < puVar6) {
        uVar7 = 6;
        if (puVar6 <= (uint *)((long)puVar2 - 5U)) {
          pcVar8 = pcVar11;
          puVar12 = (uint *)dest;
          if (dest < puVar1) {
            do {
              *(undefined8 *)puVar12 = *(undefined8 *)pcVar8;
              puVar12 = puVar12 + 2;
              pcVar8 = pcVar8 + 8;
            } while (puVar12 < puVar1);
            pcVar11 = pcVar11 + ((long)puVar1 - (long)dest);
            dest = (char *)puVar1;
          }
          uVar7 = 0;
          for (; dest < puVar6; dest = (char *)((long)dest + 1)) {
            cVar3 = *pcVar11;
            pcVar11 = pcVar11 + 1;
            *dest = cVar3;
          }
        }
        if ((uint *)((long)puVar2 - 5U) < puVar6) goto LAB_0010a9ae;
      }
      else {
        *(undefined8 *)dest = *(undefined8 *)pcVar11;
        if (0x10 < uVar10 + 4) {
          puVar12 = puVar12 + 4;
          do {
            pcVar11 = pcVar11 + 8;
            *(undefined8 *)puVar12 = *(undefined8 *)pcVar11;
            puVar12 = puVar12 + 2;
          } while (puVar12 < puVar6);
        }
      }
      uVar7 = 0;
      dest = (char *)puVar6;
    }
LAB_0010a9ae:
    local_50 = (int)source;
    switch(uVar7) {
    case 0:
    case 2:
      goto switchD_0010a9c0_caseD_0;
    default:
      goto switchD_0010a9c0_caseD_1;
    case 3:
      __src = (ushort *)(ulong)((uint)__src - local_50);
      goto LAB_0010aa49;
    case 6:
      __src = (ushort *)(ulong)(~(uint)__src + local_50);
      goto LAB_0010aa49;
    }
  }
  __src = (ushort *)(ulong)(-(uint)(*source != '\0') | 1);
LAB_0010aa49:
  return (int)__src;
switchD_0010a9c0_caseD_1:
  goto LAB_0010aa49;
}

Assistant:

int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize, endOnOutputSize, full, 0, withPrefix64k, (BYTE*)(dest - 64 KB), NULL, 64 KB);
}